

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.cc
# Opt level: O2

void __thiscall JournalOperation::status(JournalOperation *this)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = sdglib::OutputLog(false);
  poVar1 = std::operator<<(poVar1,"Operation: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1," applied on ");
  pcVar2 = ctime(&this->timestamp);
  std::operator<<(poVar1,pcVar2);
  poVar1 = sdglib::OutputLog(false);
  poVar1 = std::operator<<(poVar1,"Tool: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->tool);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = sdglib::OutputLog(false);
  poVar1 = std::operator<<(poVar1,"Details: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->detail);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void JournalOperation::status() const {
    sdglib::OutputLog(false) << "Operation: " << name << " applied on " << ctime(&timestamp);
    sdglib::OutputLog(false) << "Tool: " << tool << std::endl;
    sdglib::OutputLog(false) << "Details: " << detail << std::endl << std::endl;
}